

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  Node **ppNVar1;
  TidyTagId TVar2;
  Dict *pDVar3;
  undefined8 uVar4;
  Bool BVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node **ppNVar9;
  GetTokenMode mode_00;
  GetTokenMode extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Node *pNVar10;
  
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  uVar4 = extraout_RDX;
  while (pNVar6 != (Node *)0x0) {
    mode_00 = (GetTokenMode)uVar4;
    pDVar3 = pNVar6->tag;
    if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_HEAD)) goto LAB_0014290a;
    if ((pDVar3 == html->tag) && (pNVar6->type - StartTag < 2)) {
      prvTidyReport(doc,html,pNVar6,0x235);
      prvTidyFreeNode(doc,pNVar6);
    }
    else {
      BVar5 = InsertMisc(html,pNVar6);
      if (BVar5 == no) {
        prvTidyUngetToken(doc);
        break;
      }
    }
    pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
    uVar4 = extraout_RDX_00;
  }
  pNVar6 = prvTidyInferredTag(doc,TidyTag_HEAD);
  mode_00 = extraout_EDX;
LAB_0014290a:
  pNVar6->parent = html;
  pNVar8 = html->last;
  pNVar6->prev = pNVar8;
  ppNVar1 = &html->content;
  ppNVar9 = &pNVar8->next;
  if (pNVar8 == (Node *)0x0) {
    ppNVar9 = ppNVar1;
  }
  *ppNVar9 = pNVar6;
  html->last = pNVar6;
  prvTidyParseHead(doc,pNVar6,mode_00);
  pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar6 != (Node *)0x0) {
    pNVar7 = (Node *)0x0;
    pNVar8 = (Node *)0x0;
    do {
      pNVar10 = pNVar8;
      if (pNVar6->tag == html->tag) {
        if (pNVar8 == (Node *)0x0 && pNVar6->type != StartTag) goto LAB_001429ff;
LAB_00142a14:
        prvTidyFreeNode(doc,pNVar6);
      }
      else {
        BVar5 = InsertMisc(html,pNVar6);
        if (BVar5 == no) {
          if (pNVar6->tag != (Dict *)0x0) {
            TVar2 = pNVar6->tag->id;
            if (TVar2 == TidyTag_NOFRAMES) {
              if (pNVar6->type == StartTag) {
                if (pNVar8 == (Node *)0x0) {
                  prvTidyReport(doc,html,pNVar6,0x235);
                  prvTidyFreeNode(doc,pNVar6);
                  pNVar6 = prvTidyInferredTag(doc,TidyTag_BODY);
                  goto LAB_00142ceb;
                }
                if (pNVar7 == (Node *)0x0) {
                  pNVar6->parent = pNVar8;
                  pNVar7 = pNVar8->last;
                  ppNVar9 = &pNVar7->next;
                  if (pNVar7 == (Node *)0x0) {
                    ppNVar9 = &pNVar8->content;
                  }
                  pNVar6->prev = pNVar7;
                  *ppNVar9 = pNVar6;
                  pNVar8->last = pNVar6;
                  pNVar7 = pNVar6;
                }
                else {
                  prvTidyFreeNode(doc,pNVar6);
                }
                goto LAB_00142b98;
              }
            }
            else if (TVar2 == TidyTag_FRAMESET) {
              if (pNVar6->type == StartTag) {
                pNVar10 = pNVar6;
                if (pNVar8 != (Node *)0x0) {
                  prvTidyReport(doc,html,pNVar6,0x237);
                  pNVar10 = pNVar8;
                }
                pNVar6->parent = html;
                pNVar8 = html->last;
                pNVar6->prev = pNVar8;
                ppNVar9 = &pNVar8->next;
                if (pNVar8 == (Node *)0x0) {
                  ppNVar9 = ppNVar1;
                }
                *ppNVar9 = pNVar6;
                html->last = pNVar6;
                ParseTag(doc,pNVar6,mode);
                for (pNVar6 = pNVar10->content; pNVar6 != (Node *)0x0; pNVar6 = pNVar6->next) {
                  if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_NOFRAMES)) {
                    pNVar7 = pNVar6;
                  }
                }
                goto LAB_00142b9f;
              }
            }
            else {
              if (TVar2 != TidyTag_BODY) goto LAB_00142a24;
              if (pNVar6->type == StartTag) {
                if (((doc->config).value[1].v == 0) && (pNVar8 != (Node *)0x0)) {
                  prvTidyUngetToken(doc);
                  if (pNVar7 == (Node *)0x0) {
                    pNVar7 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
                    pNVar7->parent = pNVar8;
                    pNVar6 = pNVar8->last;
                    pNVar7->prev = pNVar6;
                    ppNVar9 = &pNVar6->next;
                    if (pNVar6 == (Node *)0x0) {
                      ppNVar9 = &pNVar8->content;
                    }
                    *ppNVar9 = pNVar7;
                    pNVar8->last = pNVar7;
                    prvTidyReport(doc,html,pNVar7,0x247);
                  }
                  else if (pNVar7->type == StartEndTag) {
                    pNVar7->type = StartTag;
                  }
                  goto LAB_00142b98;
                }
                goto LAB_00142cde;
              }
            }
LAB_001429ff:
            prvTidyReport(doc,html,pNVar6,0x235);
            goto LAB_00142a14;
          }
LAB_00142a24:
          BVar5 = prvTidynodeIsElement(pNVar6);
          if ((BVar5 == no) || (pDVar3 = pNVar6->tag, pDVar3 == (Dict *)0x0)) {
            prvTidyUngetToken(doc);
            if (pNVar8 == (Node *)0x0) {
LAB_00142cb0:
              pNVar6 = prvTidyInferredTag(doc,TidyTag_BODY);
              if (*(int *)((doc->config).value + 6) != 1) {
                prvTidyReport(doc,html,pNVar6,0x247);
              }
LAB_00142cde:
              prvTidyConstrainVersion(doc,0xfffffb6f);
LAB_00142ceb:
              pNVar6->parent = html;
              pNVar8 = html->last;
              pNVar6->prev = pNVar8;
              ppNVar9 = &pNVar8->next;
              if (pNVar8 == (Node *)0x0) {
                ppNVar9 = ppNVar1;
              }
              *ppNVar9 = pNVar6;
              html->last = pNVar6;
              ParseTag(doc,pNVar6,mode);
              return;
            }
          }
          else {
            if ((pDVar3->model & 4) != 0) {
              MoveToHead(doc,html,pNVar6);
              goto LAB_00142b9f;
            }
            if (pNVar8 == (Node *)0x0) {
              prvTidyUngetToken(doc);
              goto LAB_00142cb0;
            }
            if (pDVar3->id == TidyTag_FRAME) goto LAB_001429ff;
            prvTidyUngetToken(doc);
          }
          if (pNVar7 == (Node *)0x0) {
            pNVar7 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
            pNVar7->parent = pNVar8;
            pNVar6 = pNVar8->last;
            pNVar7->prev = pNVar6;
            ppNVar9 = &pNVar6->next;
            if (pNVar6 == (Node *)0x0) {
              ppNVar9 = &pNVar8->content;
            }
            *ppNVar9 = pNVar7;
            pNVar8->last = pNVar7;
          }
          else {
            prvTidyReport(doc,html,pNVar6,0x267);
            if (pNVar7->type == StartEndTag) {
              pNVar7->type = StartTag;
            }
          }
          prvTidyConstrainVersion(doc,0x490);
LAB_00142b98:
          ParseTag(doc,pNVar7,mode);
        }
      }
LAB_00142b9f:
      pNVar6 = prvTidyGetToken(doc,IgnoreWhitespace);
      pNVar8 = pNVar10;
    } while (pNVar6 != (Node *)0x0);
    if (pNVar10 != (Node *)0x0) {
      return;
    }
  }
  pNVar8 = prvTidyInferredTag(doc,TidyTag_BODY);
  pNVar8->parent = html;
  pNVar6 = html->last;
  pNVar8->prev = pNVar6;
  ppNVar9 = &pNVar6->next;
  if (pNVar6 == (Node *)0x0) {
    ppNVar9 = ppNVar1;
  }
  *ppNVar9 = pNVar8;
  html->last = pNVar8;
  prvTidyParseBody(doc,pNVar8,(GetTokenMode)ppNVar9);
  return;
}

Assistant:

void TY_(ParseHTML)(TidyDocImpl* doc, Node *html, GetTokenMode mode)
{
    Node *node, *head;
    Node *frameset = NULL;
    Node *noframes = NULL;

    DEBUG_LOG(SPRTF("Entering ParseHTML...\n"));
    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            node = TY_(InferredTag)(doc, TidyTag_HEAD);
            break;
        }

        if ( nodeIsHEAD(node) )
            break;

        if (node->tag == html->tag && node->type == EndTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* find and discard multiple <html> elements */
        if (node->tag == html->tag && node->type == StartTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        TY_(UngetToken)( doc );
        node = TY_(InferredTag)(doc, TidyTag_HEAD);
        break;
    }

    head = node;
    TY_(InsertNodeAtEnd)(html, head);
    TY_(ParseHead)(doc, head, mode);

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            if (frameset == NULL) /* implied body */
            {
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                TY_(InsertNodeAtEnd)(html, node);
                TY_(ParseBody)(doc, node, mode);
            }

            DEBUG_LOG(SPRTF("Exit ParseHTML 1...\n"));
            return;
        }

        /* robustly handle html tags */
        if (node->tag == html->tag)
        {
            if (node->type != StartTag && frameset == NULL)
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        /* if frameset document coerce <body> to <noframes> */
        if ( nodeIsBODY(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
            {
                if (frameset != NULL)
                {
                    TY_(UngetToken)( doc );

                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        TY_(Report)(doc, html, noframes, INSERTING_TAG);
                    }
                    else
                    {
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    ParseTag(doc, noframes, mode);
                    continue;
                }
            }

            TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
            break;  /* to parse body */
        }

        /* flag an error if we see more than one frameset */
        if ( nodeIsFRAMESET(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset != NULL)
                TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
            else
                frameset = node;

            TY_(InsertNodeAtEnd)(html, node);
            ParseTag(doc, node, mode);

            /*
              see if it includes a noframes element so
              that we can merge subsequent noframes elements
            */

            for (node = frameset->content; node; node = node->next)
            {
                if ( nodeIsNOFRAMES(node) )
                    noframes = node;
            }
            continue;
        }

        /* if not a frameset document coerce <noframes> to <body> */
        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset == NULL)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                break;
            }

            if (noframes == NULL)
            {
                noframes = node;
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
                TY_(FreeNode)( doc, node);

            ParseTag(doc, noframes, mode);
            continue;
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, html, node);
                continue;
            }

            /* discard illegal frame element following a frameset */
            if ( frameset != NULL && nodeIsFRAME(node) )
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
        }

        TY_(UngetToken)( doc );

        /* insert other content into noframes element */

        if (frameset)
        {
            if (noframes == NULL)
            {
                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
            {
                TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                if (noframes->type == StartEndTag)
                    noframes->type = StartTag;
            }

            TY_(ConstrainVersion)(doc, VERS_FRAMESET);
            ParseTag(doc, noframes, mode);
            continue;
        }

        node = TY_(InferredTag)(doc, TidyTag_BODY);
        /* Issue #132 - disable inserting BODY tag warning
           BUT only if NOT --show-body-only yes */
        if (!showingBodyOnly(doc))
            TY_(Report)(doc, html, node, INSERTING_TAG );
        TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
        break;
    }

    /* node must be body */

    TY_(InsertNodeAtEnd)(html, node);
    ParseTag(doc, node, mode);
    DEBUG_LOG(SPRTF("Exit ParseHTML 2...\n"));
}